

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Limb::GetMotorActuations
          (RS_Limb *this,array<double,_8UL> *angles,array<double,_8UL> *speeds)

{
  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar1;
  reference pvVar2;
  value_type_conflict vVar3;
  ChLinkMotor local_48 [16];
  undefined1 local_38 [8];
  shared_ptr<chrono::ChFunction_Setpoint> fun;
  int i;
  array<double,_8UL> *speeds_local;
  array<double,_8UL> *angles_local;
  RS_Limb *this_local;
  
  for (fun.super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._4_4_ = 0;
      fun.super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ < 8;
      fun.super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = fun.super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ + 1) {
    this_00 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
                 ::operator[](&this->m_motors,
                              (key_type *)
                              (motor_names_abi_cxx11_ +
                              (long)fun.
                                    super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_ * 0x20));
    std::__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_00);
    ChLinkMotor::GetMotorFunction(local_48);
    std::static_pointer_cast<chrono::ChFunction_Setpoint,chrono::ChFunction>
              ((shared_ptr<chrono::ChFunction> *)local_38);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr((shared_ptr<chrono::ChFunction> *)local_48);
    peVar1 = std::
             __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    vVar3 = (value_type_conflict)(**(code **)(*(long *)peVar1 + 0x20))(0);
    pvVar2 = std::array<double,_8UL>::operator[]
                       (angles,(long)fun.
                                     super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    *pvVar2 = vVar3;
    peVar1 = std::
             __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    vVar3 = (value_type_conflict)(**(code **)(*(long *)peVar1 + 0x28))(0);
    pvVar2 = std::array<double,_8UL>::operator[]
                       (speeds,(long)fun.
                                     super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    *pvVar2 = vVar3;
    std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Setpoint> *)local_38);
  }
  return;
}

Assistant:

void RS_Limb::GetMotorActuations(std::array<double, 8>& angles, std::array<double, 8>& speeds) {
    for (int i = 0; i < 8; i++) {
        auto fun = std::static_pointer_cast<ChFunction_Setpoint>(m_motors[motor_names[i]]->GetMotorFunction());
        // Note: the time passed as argument here does not matter for a Chfunction_Setpoint
        angles[i] = fun->Get_y(0);
        speeds[i] = fun->Get_y_dx(0);
    }
}